

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AIS.h
# Opt level: O2

int decode_AIS(char *aisbuf,int aisbuflen,double *pAIS_Latitude,double *pAIS_Longitude,
              double *pAIS_SOG,double *pAIS_COG)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ostream *poVar11;
  undefined1 *puVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  string ais_binary;
  string ais_position_accuracy;
  string temp_s;
  bitset<27UL> ii;
  bitset<28UL> hh;
  string local_1078 [32];
  string six_bit;
  string local_1038;
  string local_1018;
  string local_ff8;
  string local_fd8;
  string local_fb8;
  string local_f98;
  string local_f78;
  string local_f58;
  string six_bit_table [120];
  
  lVar10 = 0x10;
  do {
    puVar12 = (undefined1 *)((long)&six_bit_table[0]._M_dataplus._M_p + lVar10);
    *(undefined1 **)((long)six_bit_table + lVar10 + -0x10) = puVar12;
    *(undefined8 *)((long)six_bit_table + lVar10 + -8) = 0;
    *puVar12 = 0;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0xf10);
  std::__cxx11::string::assign((char *)(six_bit_table + 0x30));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x31));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x32));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x33));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x34));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x35));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x36));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x37));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x38));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x39));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x3a));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x3b));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x3c));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x3d));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x3e));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x3f));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x40));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x41));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x42));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x43));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x44));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x45));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x46));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x47));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x48));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x49));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x4a));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x4b));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x4c));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x4d));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x4e));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x4f));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x50));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x51));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x52));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x53));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x54));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x55));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x56));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x57));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x60));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x61));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x62));
  std::__cxx11::string::assign((char *)(six_bit_table + 99));
  std::__cxx11::string::assign((char *)(six_bit_table + 100));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x65));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x66));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x67));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x68));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x69));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x6a));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x6b));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x6c));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x6d));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x6e));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x6f));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x70));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x71));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x72));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x73));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x74));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x75));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x76));
  std::__cxx11::string::assign((char *)(six_bit_table + 0x77));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&six_bit,aisbuf,(allocator<char> *)&ais_binary);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ais_binary,"",(allocator<char> *)&temp_s);
  for (uVar13 = 0; uVar13 < six_bit._M_string_length; uVar13 = uVar13 + 1) {
    std::__cxx11::string::append((string *)&ais_binary);
  }
  std::__cxx11::string::substr((ulong)&temp_s,(ulong)&ais_binary);
  std::__cxx11::string::string((string *)&local_f58,(string *)&temp_s);
  iVar2 = bin_to_int_AIS(&local_f58);
  std::__cxx11::string::~string((string *)&local_f58);
  if (iVar2 - 4U < 0xfffffffd) {
    iVar2 = 1;
  }
  else {
    std::__cxx11::string::substr((ulong)&ais_position_accuracy,(ulong)&ais_binary);
    std::__cxx11::string::operator=((string *)&temp_s,(string *)&ais_position_accuracy);
    std::__cxx11::string::~string((string *)&ais_position_accuracy);
    std::__cxx11::string::string((string *)&local_f78,(string *)&temp_s);
    iVar3 = bin_to_int_AIS(&local_f78);
    std::__cxx11::string::~string((string *)&local_f78);
    std::__cxx11::string::substr((ulong)&ais_position_accuracy,(ulong)&ais_binary);
    std::__cxx11::string::operator=((string *)&temp_s,(string *)&ais_position_accuracy);
    std::__cxx11::string::~string((string *)&ais_position_accuracy);
    std::__cxx11::string::string((string *)&local_f98,(string *)&temp_s);
    iVar4 = bin_to_int_AIS(&local_f98);
    std::__cxx11::string::~string((string *)&local_f98);
    std::__cxx11::string::substr((ulong)&ais_position_accuracy,(ulong)&ais_binary);
    std::__cxx11::string::operator=((string *)&temp_s,(string *)&ais_position_accuracy);
    std::__cxx11::string::~string((string *)&ais_position_accuracy);
    std::__cxx11::string::string((string *)&local_fb8,(string *)&temp_s);
    iVar5 = bin_to_int_AIS(&local_fb8);
    std::__cxx11::string::~string((string *)&local_fb8);
    std::__cxx11::string::substr((ulong)&ais_position_accuracy,(ulong)&ais_binary);
    std::__cxx11::string::operator=((string *)&temp_s,(string *)&ais_position_accuracy);
    std::__cxx11::string::~string((string *)&ais_position_accuracy);
    std::__cxx11::string::string((string *)&local_fd8,(string *)&temp_s);
    iVar6 = bin_to_int_AIS(&local_fd8);
    std::__cxx11::string::~string((string *)&local_fd8);
    std::__cxx11::string::substr((ulong)&ais_position_accuracy,(ulong)&ais_binary);
    std::__cxx11::string::operator=((string *)&temp_s,(string *)&ais_position_accuracy);
    std::__cxx11::string::~string((string *)&ais_position_accuracy);
    std::__cxx11::string::string((string *)&local_ff8,(string *)&temp_s);
    iVar7 = bin_to_int_AIS(&local_ff8);
    std::__cxx11::string::~string((string *)&local_ff8);
    std::__cxx11::string::substr((ulong)&ais_position_accuracy,(ulong)&ais_binary);
    cVar1 = ais_binary._M_dataplus._M_p[0x3d];
    std::__cxx11::string::substr((ulong)local_1078,(ulong)&ais_binary);
    std::__cxx11::string::operator=((string *)&temp_s,local_1078);
    std::__cxx11::string::~string(local_1078);
    std::bitset<28ul>::bitset<char,std::char_traits<char>,std::allocator<char>>
              ((bitset<28ul> *)&hh,&temp_s,0);
    if (cVar1 == '1') {
      hh.super__Base_bitset<1UL>._M_w._0_4_ = ~(uint)hh.super__Base_bitset<1UL>._M_w & 0xfffffff;
      hh.super__Base_bitset<1UL>._M_w._4_4_ = 0;
    }
    auVar14._8_4_ = hh.super__Base_bitset<1UL>._M_w._4_4_;
    auVar14._0_8_ = hh.super__Base_bitset<1UL>._M_w;
    auVar14._12_4_ = 0x45300000;
    dVar16 = (((auVar14._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)hh.super__Base_bitset<1UL>._M_w) -
              4503599627370496.0)) / 10000.0) / 60.0;
    if (cVar1 == '1') {
      dVar16 = -dVar16;
    }
    cVar1 = ais_binary._M_dataplus._M_p[0x59];
    std::__cxx11::string::substr((ulong)local_1078,(ulong)&ais_binary);
    std::__cxx11::string::operator=((string *)&temp_s,local_1078);
    std::__cxx11::string::~string(local_1078);
    std::bitset<27ul>::bitset<char,std::char_traits<char>,std::allocator<char>>
              ((bitset<27ul> *)&ii,&temp_s,0);
    if (cVar1 == '1') {
      ii.super__Base_bitset<1UL>._M_w._0_4_ = ~(uint)ii.super__Base_bitset<1UL>._M_w & 0x7ffffff;
      ii.super__Base_bitset<1UL>._M_w._4_4_ = 0;
    }
    auVar15._8_4_ = ii.super__Base_bitset<1UL>._M_w._4_4_;
    auVar15._0_8_ = ii.super__Base_bitset<1UL>._M_w;
    auVar15._12_4_ = 0x45300000;
    dVar17 = (((auVar15._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)ii.super__Base_bitset<1UL>._M_w) -
              4503599627370496.0)) / 10000.0) / 60.0;
    if (cVar1 == '1') {
      dVar17 = -dVar17;
    }
    std::__cxx11::string::substr((ulong)local_1078,(ulong)&ais_binary);
    std::__cxx11::string::operator=((string *)&temp_s,local_1078);
    std::__cxx11::string::~string(local_1078);
    std::__cxx11::string::string((string *)&local_1018,(string *)&temp_s);
    iVar8 = bin_to_int_AIS(&local_1018);
    std::__cxx11::string::~string((string *)&local_1018);
    std::__cxx11::string::substr((ulong)local_1078,(ulong)&ais_binary);
    std::__cxx11::string::operator=((string *)&temp_s,local_1078);
    std::__cxx11::string::~string(local_1078);
    std::__cxx11::string::string((string *)&local_1038,(string *)&temp_s);
    iVar9 = bin_to_int_AIS(&local_1038);
    std::__cxx11::string::~string((string *)&local_1038);
    poVar11 = std::operator<<((ostream *)&std::cout,"\nmessage type = \t\t");
    std::ostream::operator<<((ostream *)poVar11,iVar2);
    poVar11 = std::operator<<((ostream *)&std::cout,"\nrepeat indicator = \t");
    std::ostream::operator<<((ostream *)poVar11,iVar3);
    poVar11 = std::operator<<(&std::cout,0x30);
    poVar11 = std::operator<<(poVar11,"\nMMSI = \t\t\t");
    *(undefined8 *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x10) = 9;
    std::ostream::operator<<((ostream *)poVar11,iVar4);
    poVar11 = std::operator<<((ostream *)&std::cout,"\nnavagation status = \t");
    std::ostream::operator<<((ostream *)poVar11,iVar5);
    poVar11 = std::operator<<((ostream *)&std::cout,"\nrate of turn = \t\t");
    std::ostream::operator<<((ostream *)poVar11,iVar6);
    poVar11 = std::operator<<((ostream *)&std::cout,"\nspeed over ground = \t");
    std::ostream::operator<<((ostream *)poVar11,iVar7 / 10);
    poVar11 = std::operator<<((ostream *)&std::cout,"\nposition accuracy = \t");
    std::operator<<(poVar11,(string *)&ais_position_accuracy);
    *(uint *)(fmod + *(long *)(std::cout + -0x18)) =
         *(uint *)(fmod + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    std::operator<<((ostream *)&std::cout,"\nlongitude = \t\t");
    std::ostream::_M_insert<double>(dVar16);
    *(uint *)(fmod + *(long *)(std::cout + -0x18)) =
         *(uint *)(fmod + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    std::operator<<((ostream *)&std::cout,"\nlatitude = \t\t");
    std::ostream::_M_insert<double>(dVar17);
    poVar11 = std::operator<<((ostream *)&std::cout,"\ncourse over ground = \t");
    std::ostream::operator<<((ostream *)poVar11,iVar8 / 10);
    poVar11 = std::operator<<((ostream *)&std::cout,"\ntrue heading = \t\t");
    std::ostream::operator<<((ostream *)poVar11,iVar9);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    *pAIS_Latitude = dVar17;
    *pAIS_Longitude = dVar16;
    *pAIS_SOG = (double)(iVar7 / 10) / 1.94;
    *pAIS_COG = ((double)(iVar8 / 10) * 3.141592653589793) / 180.0;
    std::__cxx11::string::~string((string *)&ais_position_accuracy);
    iVar2 = 0;
  }
  std::__cxx11::string::~string((string *)&temp_s);
  std::__cxx11::string::~string((string *)&ais_binary);
  std::__cxx11::string::~string((string *)&six_bit);
  lVar10 = 0xee0;
  do {
    std::__cxx11::string::~string((string *)((long)&six_bit_table[0]._M_dataplus._M_p + lVar10));
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != -0x20);
  return iVar2;
}

Assistant:

inline int decode_AIS(char* aisbuf, int aisbuflen, double* pAIS_Latitude, double* pAIS_Longitude, double* pAIS_SOG, double* pAIS_COG)
{	
	UNREFERENCED_PARAMETER(aisbuflen);

	// six bit ascii table. (gpsd.berlios.de/AIVDM)
	std::string six_bit_table[120];
	six_bit_table[48]="000000";
	six_bit_table[49]="000001";
	six_bit_table[50]="000010";
	six_bit_table[51]="000011";
	six_bit_table[52]="000100";
	six_bit_table[53]="000101";
	six_bit_table[54]="000110";
	six_bit_table[55]="000111";
	six_bit_table[56]="001000";
	six_bit_table[57]="001001";
	six_bit_table[58]="001010";
	six_bit_table[59]="001011";
	six_bit_table[60]="001100";
	six_bit_table[61]="001101";
	six_bit_table[62]="001110";
	six_bit_table[63]="001111";
	six_bit_table[64]="010000";
	six_bit_table[65]="010001";
	six_bit_table[66]="010010";
	six_bit_table[67]="010011";
	six_bit_table[68]="010100";
	six_bit_table[69]="010101";
	six_bit_table[70]="010110";
	six_bit_table[71]="010111";
	six_bit_table[72]="011000";
	six_bit_table[73]="011001";
	six_bit_table[74]="011010";
	six_bit_table[75]="011011";
	six_bit_table[76]="011100";
	six_bit_table[77]="011101";
	six_bit_table[78]="011110";
	six_bit_table[79]="011111";
	six_bit_table[80]="100000";
	six_bit_table[81]="100001";
	six_bit_table[82]="100010";
	six_bit_table[83]="100011";
	six_bit_table[84]="100100";
	six_bit_table[85]="100101";
	six_bit_table[86]="100110";
	six_bit_table[87]="100111";

	six_bit_table[96]="101000";
	six_bit_table[97]="101001";
	six_bit_table[98]="101010";
	six_bit_table[99]="101011";
	six_bit_table[100]="101100";
	six_bit_table[101]="101101";
	six_bit_table[102]="101110";
	six_bit_table[103]="101111";
	six_bit_table[104]="110000";
	six_bit_table[105]="110001";
	six_bit_table[106]="110010";
	six_bit_table[107]="110011";
	six_bit_table[108]="110100";
	six_bit_table[109]="110101";
	six_bit_table[110]="110110";
	six_bit_table[111]="110111";
	six_bit_table[112]="111000";
	six_bit_table[113]="111001";
	six_bit_table[114]="111010";
	six_bit_table[115]="111011";
	six_bit_table[116]="111100";
	six_bit_table[117]="111101";
	six_bit_table[118]="111110";
	six_bit_table[119]="111111";



	std::string six_bit=aisbuf;

	// convert 6 bit string to binary
	std::string ais_binary="";
	unsigned int x = 0;
	for (x=0; x<six_bit.length(); x++) {
		int z,y;
		z=six_bit[x];
		y=(x+1)*6-5;
		ais_binary.append(six_bit_table[z]);
		//std::cout<<z<<" "<<six_bit_table[z]<<" "<<y<<std::endl;
	}

	std::string temp_s=ais_binary.substr(0,6);
	//std::bitset<6> bb (temp_s);
	//int ais_message_type=bb.to_ulong();
	int ais_message_type=bin_to_int_AIS(temp_s);

	if ((ais_message_type < 1)||(ais_message_type > 3))
	{
		// Unhandled...
		return EXIT_FAILURE;
	}

	temp_s=ais_binary.substr(6,2);
	//std::bitset<2> cc (temp_s);
	//int ais_repeat_indicator=cc.to_ulong();
	int ais_repeat_indicator=bin_to_int_AIS(temp_s);

	temp_s=ais_binary.substr(8,30);
	//std::bitset<30> dd (temp_s);
	//int ais_mmsi=dd.to_ulong();
	int ais_mmsi=bin_to_int_AIS(temp_s);

	temp_s=ais_binary.substr(38,4);
	//std::bitset<4> ee(temp_s);
	//int ais_navigation_status=ee.to_ulong();
	int ais_navigation_status=bin_to_int_AIS(temp_s);

	temp_s=ais_binary.substr(42,8);
	//std::bitset<8> ff(temp_s);
	//int ais_rate_of_turn=ff.to_ulong();
	int ais_rate_of_turn=bin_to_int_AIS(temp_s);

	temp_s=ais_binary.substr(50,10);
	//std::bitset<10> gg(temp_s);
	//int ais_speed_over_ground=gg.to_ulong()/10;
	int ais_speed_over_ground=bin_to_int_AIS(temp_s)/10;

	std::string ais_position_accuracy=ais_binary.substr(60,1);

	char west=ais_binary[61];
	temp_s=ais_binary.substr(61,28);
	std::bitset<28> hh(temp_s);
	if (west=='1') {hh.flip();}
	double ais_longitude=hh.to_ulong();
	ais_longitude=ais_longitude/10000/60;
	if (west=='1') {ais_longitude *= -1;}


	char south=ais_binary[89];
	temp_s=ais_binary.substr(89,27);
	std::bitset<27> ii(temp_s);
	if (south=='1') {ii.flip();}
	double ais_latitude=ii.to_ulong();
	ais_latitude=ais_latitude/10000/60;
	if (south=='1') {ais_latitude *= -1;}


	temp_s=ais_binary.substr(116,12);
	//std::bitset<12> jj(temp_s);
	//int ais_course_over_ground=jj.to_ulong()/10;
	int ais_course_over_ground=bin_to_int_AIS(temp_s)/10;


	temp_s=ais_binary.substr(128,9);
	//std::bitset<9> kk(temp_s);
	//int ais_true_heading=kk.to_ulong();
	int ais_true_heading=bin_to_int_AIS(temp_s);

	std::cout<<"\nmessage type = \t\t"<<ais_message_type;
	std::cout<<"\nrepeat indicator = \t"<<ais_repeat_indicator;
	std::cout<< std::setfill('0')<< "\nMMSI = \t\t\t" << std::setw(9) <<ais_mmsi;
	std::cout<<"\nnavagation status = \t"<<ais_navigation_status;
	std::cout<<"\nrate of turn = \t\t"<<ais_rate_of_turn;
	std::cout<<"\nspeed over ground = \t"<<ais_speed_over_ground;
	std::cout<<"\nposition accuracy = \t"<<ais_position_accuracy;
	std::cout<< std::fixed << "\nlongitude = \t\t"<<ais_longitude;
	std::cout<< std::fixed << "\nlatitude = \t\t"<<ais_latitude;
	std::cout<<"\ncourse over ground = \t"<<ais_course_over_ground;
	std::cout<<"\ntrue heading = \t\t"<<ais_true_heading;
	std::cout<<std::endl;

	*pAIS_Latitude = ais_latitude;
	*pAIS_Longitude = ais_longitude;
	*pAIS_SOG = ais_speed_over_ground/1.94; // Convert to speed in m/s.
	*pAIS_COG = ais_course_over_ground*M_PI/180.0; // Convert to angle in rad.

	return EXIT_SUCCESS;
}